

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

void __thiscall Person::Person(Person *this,string *name,string *id,Address *address)

{
  int iVar1;
  string local_50 [32];
  
  this->_vptr_Person = (_func_int **)&PTR_validate_00107d90;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  Address::Address(&this->address);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->id);
  Address::operator=(&this->address,address);
  std::__cxx11::string::string(local_50,(string *)id);
  iVar1 = (**this->_vptr_Person)(this,local_50);
  std::__cxx11::string::~string(local_50);
  if ((char)iVar1 != '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid id");
  exit(1);
}

Assistant:

Person::Person(const string &name, const string &id, const Address &address) {
    this->name = name;
    this->id = id;
    this->address = address;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid id";
        exit(1);
    }
}